

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmgram.cpp
# Opt level: O2

void __thiscall CVmObjGramProd::CVmObjGramProd(CVmObjGramProd *this)

{
  byte *pbVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined8 *puVar4;
  void *pvVar5;
  char *pcVar3;
  
  (this->super_CVmObject)._vptr_CVmObject = (_func_int **)&PTR_get_metaclass_reg_0031c408;
  iVar2 = (*G_mem_X->varheap_->_vptr_CVmVarHeap[4])(G_mem_X->varheap_,0x48,this);
  pcVar3 = (char *)CONCAT44(extraout_var,iVar2);
  (this->super_CVmObject).ext_ = pcVar3;
  pcVar3[0] = '\0';
  pcVar3[1] = '\0';
  pcVar3[2] = '\0';
  pcVar3[3] = '\0';
  pcVar3[4] = '\0';
  pcVar3[5] = '\0';
  pcVar3[6] = '\0';
  pcVar3[7] = '\0';
  pcVar3 = (this->super_CVmObject).ext_;
  pcVar3[8] = '\0';
  pcVar3[9] = '\0';
  pcVar3[10] = '\0';
  pcVar3[0xb] = '\0';
  pcVar3[0xc] = '\0';
  pcVar3[0xd] = '\0';
  pcVar3[0xe] = '\0';
  pcVar3[0xf] = '\0';
  pbVar1 = (byte *)((this->super_CVmObject).ext_ + 0x14);
  *pbVar1 = *pbVar1 & 0xfe;
  pcVar3 = (this->super_CVmObject).ext_;
  pcVar3[0x30] = '\0';
  pcVar3[0x31] = '\0';
  pcVar3[0x32] = '\0';
  pcVar3[0x33] = '\0';
  pcVar3[0x34] = '\0';
  pcVar3[0x35] = '\0';
  pcVar3[0x36] = '\0';
  pcVar3[0x37] = '\0';
  pcVar3 = (this->super_CVmObject).ext_;
  pcVar3[0x38] = '\0';
  pcVar3[0x39] = '\0';
  pcVar3[0x3a] = '\0';
  pcVar3[0x3b] = '\0';
  pcVar3[0x3c] = '\0';
  pcVar3[0x3d] = '\0';
  pcVar3[0x3e] = '\0';
  pcVar3[0x3f] = '\0';
  pcVar3 = (this->super_CVmObject).ext_;
  pcVar3[0x40] = '\0';
  pcVar3[0x41] = '\0';
  pcVar3[0x42] = '\0';
  pcVar3[0x43] = '\0';
  pcVar3[0x44] = '\0';
  pcVar3[0x45] = '\0';
  pcVar3[0x46] = '\0';
  pcVar3[0x47] = '\0';
  pbVar1 = (byte *)((this->super_CVmObject).ext_ + 0x14);
  *pbVar1 = *pbVar1 & 0xfd;
  pcVar3 = (this->super_CVmObject).ext_;
  pcVar3[0x10] = '\0';
  pcVar3[0x11] = '\0';
  pcVar3[0x12] = '\0';
  pcVar3[0x13] = '\0';
  pbVar1 = (byte *)((this->super_CVmObject).ext_ + 0x14);
  *pbVar1 = *pbVar1 & 0xfb;
  puVar4 = (undefined8 *)operator_new(0x20);
  *puVar4 = 0;
  puVar4[1] = 0;
  puVar4[2] = 0;
  puVar4[3] = 0;
  *(undefined8 **)((this->super_CVmObject).ext_ + 0x18) = puVar4;
  pcVar3 = (this->super_CVmObject).ext_;
  pcVar3[0x28] = '@';
  pcVar3[0x29] = '\0';
  pcVar3[0x2a] = '\0';
  pcVar3[0x2b] = '\0';
  pcVar3[0x2c] = '\0';
  pcVar3[0x2d] = '\0';
  pcVar3[0x2e] = '\0';
  pcVar3[0x2f] = '\0';
  pcVar3 = (this->super_CVmObject).ext_;
  pvVar5 = malloc(*(long *)(pcVar3 + 0x28) * 2);
  *(void **)(pcVar3 + 0x20) = pvVar5;
  return;
}

Assistant:

CVmObjGramProd::CVmObjGramProd(VMG0_)
{
    /* allocate our extension structure from the variable heap */
    ext_ = (char *)G_mem->get_var_heap()
           ->alloc_mem(sizeof(vm_gram_ext), this);

    /* we have no image data yet */
    get_ext()->image_data_ = 0;
    get_ext()->image_data_size_ = 0;

    /* we haven't been modified yet */
    get_ext()->modified_ = FALSE;

    /* we haven't set up our alternatives yet */
    get_ext()->alts_ = 0;
    get_ext()->alt_cnt_ = 0;
    get_ext()->alt_alo_ = 0;

    /* we haven't cached any hash values yet */
    get_ext()->hashes_cached_ = FALSE;
    get_ext()->comparator_ = VM_INVALID_OBJ;

    /* presume we have no circular rules */
    get_ext()->has_circular_alt = FALSE;

    /* create our memory pool */
    get_ext()->mem_ = new CVmGramProdMem();

    /* 
     *   allocate initial property enumeration space (we'll expand this as
     *   needed, so the initial size is just a guess) 
     */
    get_ext()->prop_enum_max_ = 64;
    get_ext()->prop_enum_arr_ = (vmgram_match_info *)
                                t3malloc(get_ext()->prop_enum_max_
                                         * sizeof(vmgram_match_info));
}